

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack10_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3ff) + base;
  out[1] = (*in >> 10 & 0x3ff) + base;
  out[2] = (*in >> 0x14 & 0x3ff) + base;
  uVar1 = *in;
  out[3] = uVar1 >> 0x1e;
  out[3] = (uVar1 >> 0x1e) + base + (in[1] & 0xff) * 4;
  out[4] = (in[1] >> 8 & 0x3ff) + base;
  out[5] = (in[1] >> 0x12 & 0x3ff) + base;
  uVar1 = in[1];
  out[6] = uVar1 >> 0x1c;
  out[6] = (uVar1 >> 0x1c) + base + (in[2] & 0x3f) * 0x10;
  out[7] = (in[2] >> 6 & 0x3ff) + base;
  out[8] = (*(ushort *)((long)in + 10) & 0x3ff) + base;
  uVar1 = in[2];
  out[9] = uVar1 >> 0x1a;
  out[9] = (uVar1 >> 0x1a) + base + (in[3] & 0xf) * 0x40;
  out[10] = (in[3] >> 4 & 0x3ff) + base;
  out[0xb] = (in[3] >> 0xe & 0x3ff) + base;
  uVar1 = in[3];
  out[0xc] = uVar1 >> 0x18;
  out[0xc] = (uVar1 >> 0x18) + base + (in[4] & 3) * 0x100;
  out[0xd] = (in[4] >> 2 & 0x3ff) + base;
  out[0xe] = (in[4] >> 0xc & 0x3ff) + base;
  out[0xf] = (in[4] >> 0x16) + base;
  return in + 5;
}

Assistant:

uint32_t * unpack10_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 10 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 10 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 10 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 10 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 10 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}